

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O0

void init_tables(void)

{
  byte bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  int local_34;
  double m;
  double o;
  int local_10;
  int n;
  int x;
  int i;
  
  if (tablesInit == '\0') {
    tablesInit = '\x01';
    for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 1) {
      dVar2 = pow(2.0,((double)(local_10 + 1) * 0.03125) / 8.0);
      dVar2 = floor(65536.0 / dVar2);
      o._4_4_ = (int)dVar2 >> 5;
      if (((int)dVar2 >> 4 & 1U) != 0) {
        o._4_4_ = o._4_4_ + 1;
      }
      tl_tab[local_10 << 1] = o._4_4_ << 2;
      tl_tab[local_10 * 2 + 1] = -tl_tab[local_10 << 1];
      for (n = 1; n < 0xd; n = n + 1) {
        bVar1 = (byte)n & 0x1f;
        tl_tab[local_10 * 2 + n * 0x200] = tl_tab[local_10 << 1] >> bVar1;
        tl_tab[local_10 * 2 + 1 + n * 0x200] = (0 >> bVar1) - tl_tab[local_10 * 2 + n * 0x200];
      }
    }
    for (n = 0; n < 0x400; n = n + 1) {
      dVar2 = sin(((double)(n * 2 + 1) * 3.141592653589793) / 1024.0);
      dVar3 = log(1.0 / ABS(dVar2));
      dVar4 = log(2.0);
      uVar5 = (uint)((((dVar3 * 8.0) / dVar4) / 0.03125) * 2.0);
      o._4_4_ = (int)uVar5 >> 1;
      if ((uVar5 & 1) != 0) {
        o._4_4_ = o._4_4_ + 1;
      }
      sin_tab[n] = o._4_4_ * 2 + (uint)(dVar2 < 0.0);
    }
    for (n = 0; n < 0x10; n = n + 1) {
      if (n == 0xf) {
        local_34 = 0x1f;
      }
      else {
        local_34 = n;
      }
      d1l_tab[n] = (UINT32)(long)((double)local_34 * 32.0);
    }
  }
  return;
}

Assistant:

static int init_tables(void)
{
	signed int i,x;
	signed int n;
	double o,m;

	if (tablesInit)
		return 1;
	tablesInit = 1;

	for (x=0; x<TL_RES_LEN; x++)
	{
		m = (1<<16) / pow(2, (x+1) * (ENV_STEP/4.0) / 8.0);
		m = floor(m);

		/* we never reach (1<<16) here due to the (x+1) */
		/* result fits within 16 bits at maximum */

		n = (int)m;     /* 16 bits here */
		n >>= 4;        /* 12 bits here */
		if (n&1)        /* round to nearest */
			n = (n>>1)+1;
		else
			n = n>>1;
						/* 11 bits here (rounded) */
		n <<= 1;        /* 12 bits here (as in real chip) */
		tl_tab[ x*2 + 0 ] = n;
		tl_tab[ x*2 + 1 ] = -tl_tab[ x*2 + 0 ];

		for (i=1; i<12; i++)
		{
			tl_tab[ x*2+0 + i*2*TL_RES_LEN ] =  tl_tab[ x*2+0 ]>>i;
			tl_tab[ x*2+1 + i*2*TL_RES_LEN ] = -tl_tab[ x*2+0 + i*2*TL_RES_LEN ];
		}
	#if 0
			logerror("tl %04i", x*2);
			for (i=0; i<12; i++)
				logerror(", [%02i] %5i", i*2, tl_tab[ x*2 /*+1*/ + i*2*TL_RES_LEN ] );
			logerror("\n");
	#endif
	}
	/*logerror("FMOPL.C: TL_TAB_LEN = %i elements (%i bytes)\n",TL_TAB_LEN, (int)sizeof(tl_tab));*/


	for (i=0; i<SIN_LEN; i++)
	{
		/* non-standard sinus */
		m = sin( ((i*2)+1) * M_PI / SIN_LEN ); /* checked against the real chip */

		/* we never reach zero here due to ((i*2)+1) */

		if (m>0.0)
			o = 8*log(1.0/m)/log(2.0);  /* convert to 'decibels' */
		else
			o = 8*log(-1.0/m)/log(2.0); /* convert to 'decibels' */

		o = o / (ENV_STEP/4);

		n = (int)(2.0*o);
		if (n&1)                        /* round to nearest */
			n = (n>>1)+1;
		else
			n = n>>1;

		sin_tab[ i ] = n*2 + (m>=0.0? 0: 1 );

		/*logerror("FMOPL.C: sin [%4i (hex=%03x)]= %4i (tl_tab value=%5i)\n", i, i, sin_tab[i], tl_tab[sin_tab[i]] );*/
	}

	for (i=0; i<SIN_LEN; i++)
	{
		/* waveform 1:  __      __     */
		/*             /  \____/  \____*/
		/* output only first half of the sinus waveform (positive one) */

		if (i & (1<<(SIN_BITS-1)) )
			sin_tab[1*SIN_LEN+i] = TL_TAB_LEN;
		else
			sin_tab[1*SIN_LEN+i] = sin_tab[i];

		/* waveform 2:  __  __  __  __ */
		/*             /  \/  \/  \/  \*/
		/* abs(sin) */

		sin_tab[2*SIN_LEN+i] = sin_tab[i & (SIN_MASK>>1) ];

		/* waveform 3:  _   _   _   _  */
		/*             / |_/ |_/ |_/ |_*/
		/* abs(output only first quarter of the sinus waveform) */

		if (i & (1<<(SIN_BITS-2)) )
			sin_tab[3*SIN_LEN+i] = TL_TAB_LEN;
		else
			sin_tab[3*SIN_LEN+i] = sin_tab[i & (SIN_MASK>>2)];

		/*logerror("FMOPL.C: sin1[%4i]= %4i (tl_tab value=%5i)\n", i, sin_tab[1*SIN_LEN+i], tl_tab[sin_tab[1*SIN_LEN+i]] );
		logerror("FMOPL.C: sin2[%4i]= %4i (tl_tab value=%5i)\n", i, sin_tab[2*SIN_LEN+i], tl_tab[sin_tab[2*SIN_LEN+i]] );
		logerror("FMOPL.C: sin3[%4i]= %4i (tl_tab value=%5i)\n", i, sin_tab[3*SIN_LEN+i], tl_tab[sin_tab[3*SIN_LEN+i]] );*/
	}
	/*logerror("FMOPL.C: ENV_QUIET= %08x (dec*8=%i)\n", ENV_QUIET, ENV_QUIET*8 );*/


	return 1;
}